

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::ScalarReplacementPass::ReplaceWholeLoad
          (ScalarReplacementPass *this,Instruction *load,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  uint32_t *puVar1;
  IRContext *pIVar2;
  ScalarReplacementPass *pSVar3;
  pointer ppIVar4;
  uint32_t uVar5;
  array<signed_char,_4UL> aVar6;
  int iVar7;
  uint32_t uVar8;
  array<signed_char,_4UL> aVar9;
  Instruction *pIVar10;
  Operand *pOVar11;
  mapped_type *ppBVar12;
  uint uVar13;
  pointer ppIVar14;
  pointer ppIVar15;
  bool bVar16;
  iterator where;
  Operand copy;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> newLoad;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  compositeConstruct;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> loads;
  Instruction *var;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_118;
  uint32_t local_10c;
  undefined1 local_108 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_e0;
  ScalarReplacementPass *local_d8;
  undefined1 local_d0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_b0;
  Instruction *local_a8;
  uint32_t local_9c;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_98;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_78;
  BasicBlock *local_58;
  pointer local_50;
  Instruction *local_48;
  IRContext *local_40;
  Instruction *local_38;
  
  local_58 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,load);
  local_78.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (Instruction **)0x0;
  local_78.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Instruction **)0x0;
  local_78.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (Instruction **)0x0;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::reserve
            (&local_78,
             (long)(replacements->
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(replacements->
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3);
  ppIVar14 = (replacements->
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppIVar15 = (replacements->
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_118._M_head_impl = load;
  local_d8 = this;
  ppIVar4 = ppIVar15;
  if (ppIVar14 != ppIVar15) {
    do {
      local_50 = ppIVar4;
      local_48 = *ppIVar14;
      if (local_48->opcode_ == OpVariable) {
        pIVar10 = GetStorageType(this,local_48);
        uVar5 = Pass::TakeNextId((Pass *)this);
        if (uVar5 == 0) {
          iVar7 = 1;
          ppIVar15 = local_50;
        }
        else {
          local_10c = uVar5;
          local_38 = (Instruction *)operator_new(0x70);
          local_40 = (this->super_MemPass).super_Pass.context_;
          aVar6._M_elems[0] = '\0';
          aVar6._M_elems[1] = '\0';
          aVar6._M_elems[2] = '\0';
          aVar6._M_elems[3] = '\0';
          uVar5 = 0;
          if (pIVar10->has_result_id_ == true) {
            uVar5 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
          }
          local_9c = uVar5;
          if (local_48->has_result_id_ == true) {
            aVar6._M_elems =
                 (_Type)Instruction::GetSingleWordOperand(local_48,(uint)local_48->has_type_id_);
          }
          local_d0._0_8_ = &PTR__SmallVector_00b15d78;
          local_d0._24_8_ = local_d0 + 0x10;
          local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_d0._8_8_ = 1;
          local_108._0_4_ = 1;
          local_108._8_8_ = &PTR__SmallVector_00b15d78;
          local_108._16_8_ = (pointer)0x0;
          local_108._32_8_ = local_108 + 0x18;
          local_e0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_d0._16_4_ = aVar6._M_elems;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)(local_108 + 8),
                     (SmallVector<unsigned_int,_2UL> *)local_d0);
          local_98.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_98.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_98.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_98.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
          puVar1 = &((Instruction *)
                    local_98.
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_start)->unique_id_;
          *(undefined4 *)
           &(((Instruction *)
             local_98.
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start)->
            super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
               local_108._0_4_;
          (((Instruction *)
           local_98.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start)->
          super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ =
               (Instruction *)&PTR__SmallVector_00b15d78;
          (((Instruction *)
           local_98.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start)->
          super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = (Instruction *)0x0;
          ((Instruction *)
          local_98.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start)->context_ =
               (IRContext *)
               &(((Instruction *)
                 local_98.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_;
          ((Instruction *)
          local_98.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start)->opcode_ = OpNop;
          ((Instruction *)
          local_98.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start)->has_type_id_ = false;
          ((Instruction *)
          local_98.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start)->has_result_id_ = false;
          *(undefined2 *)
           &((Instruction *)
            local_98.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start)->field_0x2e = 0;
          local_98.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar1;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)
                     &(((Instruction *)
                       local_98.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_,
                     (SmallVector<unsigned_int,_2UL> *)(local_108 + 8));
          pIVar10 = local_38;
          local_98.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar1;
          Instruction::Instruction(local_38,local_40,OpLoad,local_9c,local_10c,&local_98);
          local_a8 = pIVar10;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    (&local_98);
          ppIVar15 = local_50;
          local_108._8_8_ = &PTR__SmallVector_00b15d78;
          if (local_e0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_e0,local_e0._M_head_impl);
          }
          local_e0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_d0._0_8_ = &PTR__SmallVector_00b15d78;
          if (local_b0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_b0,local_b0._M_head_impl);
          }
          uVar13 = (load->has_result_id_ & 1) + 1;
          if (load->has_type_id_ == false) {
            uVar13 = (uint)load->has_result_id_;
          }
          if (1 < (int)((ulong)((long)(load->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(load->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555
                  - uVar13) {
            uVar5 = 1;
            do {
              pOVar11 = Instruction::GetInOperand(load,uVar5);
              local_108._0_4_ = pOVar11->type;
              local_108._8_8_ = &PTR__SmallVector_00b15d78;
              local_108._16_8_ = (pointer)0x0;
              local_108._32_8_ = local_108 + 0x18;
              local_e0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
              utils::SmallVector<unsigned_int,_2UL>::operator=
                        ((SmallVector<unsigned_int,_2UL> *)(local_108 + 8),&pOVar11->words);
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
              emplace_back<spvtools::opt::Operand>(&local_a8->operands_,(Operand *)local_108);
              local_108._8_8_ = &PTR__SmallVector_00b15d78;
              if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )local_e0._M_head_impl !=
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&local_e0,local_e0._M_head_impl);
              }
              uVar5 = uVar5 + 1;
              uVar13 = (load->has_result_id_ & 1) + 1;
              if (load->has_type_id_ == false) {
                uVar13 = (uint)load->has_result_id_;
              }
            } while (uVar5 < (int)((ulong)((long)(load->operands_).
                                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(load->operands_).
                                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                             -0x55555555 - uVar13);
          }
          InstructionList::iterator::InsertBefore
                    ((iterator *)local_108,
                     (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)&local_118);
          local_118._M_head_impl = (Instruction *)local_108._0_8_;
          pIVar2 = (local_d8->super_MemPass).super_Pass.context_;
          if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar2);
          }
          analysis::DefUseManager::AnalyzeInstDefUse
                    ((pIVar2->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl,local_118._M_head_impl);
          this = local_d8;
          pIVar2 = (local_d8->super_MemPass).super_Pass.context_;
          local_108._0_8_ = local_118._M_head_impl;
          if ((pIVar2->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
            ppBVar12 = std::__detail::
                       _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&pIVar2->instr_to_block_,(key_type *)local_108);
            *ppBVar12 = local_58;
          }
          Instruction::UpdateDebugInfoFrom(local_118._M_head_impl,load);
          local_108._0_8_ = local_118._M_head_impl;
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          emplace_back<spvtools::opt::Instruction*>
                    ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)&local_78,(Instruction **)local_108);
          if (local_a8 != (Instruction *)0x0) {
            (*(local_a8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
              _vptr_IntrusiveNodeBase[1])();
          }
          iVar7 = 0;
        }
      }
      else {
        if (local_78.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_78.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          _M_realloc_insert<spvtools::opt::Instruction*const&>
                    ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)&local_78,
                     (iterator)
                     local_78.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_48);
        }
        else {
          *local_78.
           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = local_48;
          local_78.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_78.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        iVar7 = 3;
      }
      if ((iVar7 != 3) && (iVar7 != 0)) {
        bVar16 = false;
        goto LAB_004fc6a9;
      }
      ppIVar14 = ppIVar14 + 1;
      ppIVar4 = local_50;
    } while (ppIVar14 != ppIVar15);
  }
  uVar5 = Pass::TakeNextId((Pass *)this);
  bVar16 = uVar5 != 0;
  if (bVar16) {
    local_118._M_head_impl = load;
    pIVar10 = (Instruction *)operator_new(0x70);
    pIVar2 = (this->super_MemPass).super_Pass.context_;
    uVar8 = 0;
    if (load->has_type_id_ == true) {
      uVar8 = Instruction::GetSingleWordOperand(load,0);
    }
    local_108._0_8_ = (Instruction *)0x0;
    local_108._8_8_ = (pointer)0x0;
    local_108._16_8_ = (pointer)0x0;
    local_10c = uVar5;
    Instruction::Instruction
              (pIVar10,pIVar2,OpCompositeConstruct,uVar8,uVar5,
               (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_108)
    ;
    local_98.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)pIVar10;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_108)
    ;
    ppIVar14 = local_78.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_78.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppIVar15 = local_78.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      do {
        pIVar10 = *ppIVar15;
        aVar9._M_elems[0] = '\0';
        aVar9._M_elems[1] = '\0';
        aVar9._M_elems[2] = '\0';
        aVar9._M_elems[3] = '\0';
        if (pIVar10->has_result_id_ == true) {
          aVar9._M_elems =
               (_Type)Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
        }
        local_d0._0_8_ = &PTR__SmallVector_00b15d78;
        local_d0._24_8_ = local_d0 + 0x10;
        local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_d0._8_8_ = 1;
        local_108._0_4_ = 1;
        local_108._8_8_ = &PTR__SmallVector_00b15d78;
        local_108._16_8_ = (pointer)0x0;
        local_108._32_8_ = local_108 + 0x18;
        local_e0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_d0._16_4_ = aVar9._M_elems;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)(local_108 + 8),
                   (SmallVector<unsigned_int,_2UL> *)local_d0);
        local_d0._0_8_ = &PTR__SmallVector_00b15d78;
        if (local_b0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_b0,local_b0._M_head_impl);
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>
                  ((OperandList *)
                   ((long)local_98.
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x38),(Operand *)local_108);
        local_108._8_8_ = &PTR__SmallVector_00b15d78;
        if (local_e0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_e0,local_e0._M_head_impl);
        }
        ppIVar15 = ppIVar15 + 1;
      } while (ppIVar15 != ppIVar14);
    }
    InstructionList::iterator::InsertBefore
              ((iterator *)local_108,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)&local_118);
    local_118._M_head_impl = (Instruction *)local_108._0_8_;
    pIVar2 = (local_d8->super_MemPass).super_Pass.context_;
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar2);
    }
    analysis::DefUseManager::AnalyzeInstDefUse
              ((pIVar2->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               local_118._M_head_impl);
    Instruction::UpdateDebugInfoFrom(local_118._M_head_impl,load);
    pSVar3 = local_d8;
    pIVar2 = (local_d8->super_MemPass).super_Pass.context_;
    local_108._0_8_ = local_118._M_head_impl;
    if ((pIVar2->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
      ppBVar12 = std::__detail::
                 _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&pIVar2->instr_to_block_,(key_type *)local_108);
      *ppBVar12 = local_58;
    }
    uVar5 = local_10c;
    pIVar2 = (pSVar3->super_MemPass).super_Pass.context_;
    uVar8 = 0;
    if (load->has_result_id_ == true) {
      uVar8 = Instruction::GetSingleWordOperand(load,(uint)load->has_type_id_);
    }
    IRContext::ReplaceAllUsesWith(pIVar2,uVar8,uVar5);
    if ((Instruction *)
        local_98.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_start != (Instruction *)0x0) {
      (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)
        &(local_98.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start)->type)->_vptr_IntrusiveNodeBase[1])();
    }
    bVar16 = true;
  }
LAB_004fc6a9:
  if (local_78.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (Instruction **)0x0) {
    operator_delete(local_78.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar16;
}

Assistant:

bool ScalarReplacementPass::ReplaceWholeLoad(
    Instruction* load, const std::vector<Instruction*>& replacements) {
  // Replaces the load of the entire composite with a load from each replacement
  // variable followed by a composite construction.
  BasicBlock* block = context()->get_instr_block(load);
  std::vector<Instruction*> loads;
  loads.reserve(replacements.size());
  BasicBlock::iterator where(load);
  for (auto var : replacements) {
    // Create a load of each replacement variable.
    if (var->opcode() != spv::Op::OpVariable) {
      loads.push_back(var);
      continue;
    }

    Instruction* type = GetStorageType(var);
    uint32_t loadId = TakeNextId();
    if (loadId == 0) {
      return false;
    }
    std::unique_ptr<Instruction> newLoad(
        new Instruction(context(), spv::Op::OpLoad, type->result_id(), loadId,
                        std::initializer_list<Operand>{
                            {SPV_OPERAND_TYPE_ID, {var->result_id()}}}));
    // Copy memory access attributes which start at index 1. Index 0 is the
    // pointer to load.
    for (uint32_t i = 1; i < load->NumInOperands(); ++i) {
      Operand copy(load->GetInOperand(i));
      newLoad->AddOperand(std::move(copy));
    }
    where = where.InsertBefore(std::move(newLoad));
    get_def_use_mgr()->AnalyzeInstDefUse(&*where);
    context()->set_instr_block(&*where, block);
    where->UpdateDebugInfoFrom(load);
    loads.push_back(&*where);
  }

  // Construct a new composite.
  uint32_t compositeId = TakeNextId();
  if (compositeId == 0) {
    return false;
  }
  where = load;
  std::unique_ptr<Instruction> compositeConstruct(
      new Instruction(context(), spv::Op::OpCompositeConstruct, load->type_id(),
                      compositeId, {}));
  for (auto l : loads) {
    Operand op(SPV_OPERAND_TYPE_ID,
               std::initializer_list<uint32_t>{l->result_id()});
    compositeConstruct->AddOperand(std::move(op));
  }
  where = where.InsertBefore(std::move(compositeConstruct));
  get_def_use_mgr()->AnalyzeInstDefUse(&*where);
  where->UpdateDebugInfoFrom(load);
  context()->set_instr_block(&*where, block);
  context()->ReplaceAllUsesWith(load->result_id(), compositeId);
  return true;
}